

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

void __thiscall
duckdb::Transformer::SetParam
          (Transformer *this,string *identifier,idx_t index,PreparedParamType type)

{
  Transformer *pTVar1;
  mapped_type *pmVar2;
  PreparedParamType in_CL;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RDX;
  Transformer *root;
  PreparedParamType in_stack_00000046;
  PreparedParamType in_stack_00000047;
  key_type *in_stack_ffffffffffffffc8;
  Transformer *in_stack_ffffffffffffffd0;
  
  pTVar1 = RootTransformer(in_stack_ffffffffffffffd0);
  ParamTypeCheck(in_stack_00000047,in_stack_00000046);
  pTVar1->last_param_type = in_CL;
  pmVar2 = ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](in_RDX,in_stack_ffffffffffffffc8);
  *pmVar2 = (mapped_type)in_RDX;
  return;
}

Assistant:

void Transformer::SetParam(const string &identifier, idx_t index, PreparedParamType type) {
	auto &root = RootTransformer();
	ParamTypeCheck(root.last_param_type, type);
	root.last_param_type = type;
	D_ASSERT(!root.named_param_map.count(identifier));
	root.named_param_map[identifier] = index;
}